

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectwriter.cc
# Opt level: O2

bool __thiscall
google::protobuf::util::converter::ProtoStreamObjectWriter::IsMap
          (ProtoStreamObjectWriter *this,Field *field)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  TypeInfo *pTVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  StringPiece local_30;
  
  str = (field->type_url_).ptr_;
  bVar2 = false;
  if (((str->_M_string_length != 0) && (bVar2 = false, field->kind_ == 0xb)) &&
     (field->cardinality_ == 3)) {
    pTVar1 = (this->super_ProtoWriter).typeinfo_;
    StringPiece::StringPiece<std::allocator<char>>(&local_30,str);
    iVar3 = (*pTVar1->_vptr_TypeInfo[3])(pTVar1,local_30.ptr_,local_30.length_);
    bVar2 = converter::IsMap(field,(Type *)CONCAT44(extraout_var,iVar3));
  }
  return bVar2;
}

Assistant:

bool ProtoStreamObjectWriter::IsMap(const google::protobuf::Field& field) {
  if (field.type_url().empty() ||
      field.kind() != google::protobuf::Field::TYPE_MESSAGE ||
      field.cardinality() != google::protobuf::Field::CARDINALITY_REPEATED) {
    return false;
  }
  const google::protobuf::Type* field_type =
      typeinfo()->GetTypeByTypeUrl(field.type_url());

  return converter::IsMap(field, *field_type);
}